

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall Scene::update(Scene *this,ResourcePack *resource_pack)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pfVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  float *pfVar6;
  uint *puVar7;
  Mesh *pMVar8;
  ostream *poVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  iterator iVar13;
  iterator iVar14;
  vector<float,_std::allocator<float>_> *this_01;
  int iVar15;
  float fVar16;
  string box_mesh;
  
  this_01 = &this->grid_vertices;
  std::vector<float,_std::allocator<float>_>::reserve
            (this_01,((long)this->grid_width + 1) * ((long)this->grid_height + 1));
  iVar4 = this->grid_height;
  if (-1 < iVar4) {
    this_00 = &this->grid_indices;
    iVar10 = this->grid_width;
    iVar12 = 0;
    do {
      iVar15 = iVar12 + 1;
      if (-1 < iVar10) {
        iVar4 = 0;
        do {
          fVar16 = (float)(this->grid_cell_size * iVar4 + this->grid_start_x);
          box_mesh._M_dataplus._M_p._0_4_ = fVar16;
          iVar13._M_current =
               (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pfVar6 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (iVar13._M_current == pfVar6) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar13,(float *)&box_mesh);
            iVar13._M_current =
                 (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pfVar6 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar13._M_current = fVar16;
            iVar13._M_current = iVar13._M_current + 1;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar13._M_current;
          }
          box_mesh._M_dataplus._M_p._0_4_ = -1.0;
          if (iVar13._M_current == pfVar6) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar13,(float *)&box_mesh);
            iVar13._M_current =
                 (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pfVar6 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar13._M_current = -1.0;
            iVar13._M_current = iVar13._M_current + 1;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar13._M_current;
          }
          fVar16 = (float)(this->grid_cell_size * iVar12 + this->grid_start_y);
          box_mesh._M_dataplus._M_p._0_4_ = fVar16;
          if (iVar13._M_current == pfVar6) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_01,iVar13,(float *)&box_mesh);
          }
          else {
            *iVar13._M_current = fVar16;
            (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar13._M_current + 1;
          }
          iVar10 = this->grid_height;
          if (iVar12 < iVar10 && iVar4 < iVar10) {
            uVar11 = (iVar10 + 1) * iVar12 + iVar4;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            iVar14._M_current =
                 (this->grid_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar7 = (this->grid_indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
              iVar14._M_current =
                   (this->grid_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar7 = (this->grid_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar14._M_current = uVar11;
              iVar14._M_current = iVar14._M_current + 1;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current;
            }
            uVar11 = (this->grid_height + 1) * iVar12 + iVar4 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
              iVar14._M_current =
                   (this->grid_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar7 = (this->grid_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar14._M_current = uVar11;
              iVar14._M_current = iVar14._M_current + 1;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current;
            }
            uVar11 = (this->grid_height + 1) * iVar15 + iVar4;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
              iVar14._M_current =
                   (this->grid_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar7 = (this->grid_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar14._M_current = uVar11;
              iVar14._M_current = iVar14._M_current + 1;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current;
            }
            uVar11 = (this->grid_height + 1) * iVar12 + iVar4 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
              iVar14._M_current =
                   (this->grid_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar7 = (this->grid_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar14._M_current = uVar11;
              iVar14._M_current = iVar14._M_current + 1;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current;
            }
            uVar11 = (this->grid_height + 1) * iVar15 + iVar4;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
              iVar14._M_current =
                   (this->grid_indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar7 = (this->grid_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar14._M_current = uVar11;
              iVar14._M_current = iVar14._M_current + 1;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current;
            }
            uVar11 = (this->grid_height + 1) * iVar15 + iVar4 + 1;
            box_mesh._M_dataplus._M_p._0_4_ = (float)uVar11;
            if (iVar14._M_current == puVar7) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,iVar14,(uint *)&box_mesh);
            }
            else {
              *iVar14._M_current = uVar11;
              (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
          }
          iVar10 = this->grid_width;
          bVar3 = iVar4 < iVar10;
          iVar4 = iVar4 + 1;
        } while (bVar3);
        iVar4 = this->grid_height;
      }
      bVar3 = iVar12 < iVar4;
      iVar12 = iVar15;
    } while (bVar3);
  }
  (*__glewGenBuffers)(1,&this->grid_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  pfVar1 = (this->grid_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(this->grid_vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1,pfVar1,0x88e4);
  (*__glewGenBuffers)(1,&this->grid_index_buffer);
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  puVar2 = (this->grid_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8893,(long)(this->grid_indices).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2,puVar2,
                      0x88e4);
  (*__glewGenFramebuffers)(1,&this->depth_map_framebuffer);
  glGenTextures(1,&this->depth_map);
  glBindTexture(0xde1,this->depth_map);
  glTexImage2D(0xde1,0,0x1902,this->shadow_width,this->shadow_height,0,0x1902,0x1406,0);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->depth_map,0);
  glDrawBuffer(0);
  glReadBuffer(0);
  GVar5 = (*__glewCheckFramebufferStatus)(0x8d40);
  if (GVar5 != 0x8cd5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error creating texture",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  (*__glewBindFramebuffer)(0x8d40,0);
  box_mesh._M_dataplus._M_p = (pointer)&box_mesh.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&box_mesh,"box","");
  pMVar8 = ResourcePack::get_mesh(resource_pack,&box_mesh);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  (*__glewGenBuffers)(1,&this->object_vertex_buffer);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  pfVar1 = (pMVar8->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar8->vertices).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1,pfVar1,0x88e4);
  (*__glewGenBuffers)(1,&this->object_normal_buffer);
  (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
  pfVar1 = (pMVar8->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*__glewBufferData)(0x8892,(long)(pMVar8->normals).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1,pfVar1,0x88e4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)box_mesh._M_dataplus._M_p != &box_mesh.field_2) {
    operator_delete(box_mesh._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scene::update(ResourcePack& resource_pack) {
    grid_vertices.reserve((grid_height+1)*(grid_width+1));
    for(int i=0; i < grid_height+1; ++i) {
        for(int j=0; j < grid_width+1; ++j) {
            grid_vertices.push_back(grid_start_x+grid_cell_size*j);
            grid_vertices.push_back(-1.0);
            grid_vertices.push_back(grid_start_y+grid_cell_size*i);
            if ((i<grid_height) && (j<grid_height)) {
                grid_indices.push_back(i*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back(i*(grid_height+1)+j+1);
                grid_indices.push_back((i+1)*(grid_height+1)+j);
                grid_indices.push_back((i+1)*(grid_height+1)+j+1);
            }
        }
    }
    glGenBuffers(1, &grid_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(grid_vertices[0]) * grid_vertices.size(), grid_vertices.data(), GL_STATIC_DRAW);
    glGenBuffers(1, &grid_index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(grid_indices[0])*grid_indices.size(), grid_indices.data(), GL_STATIC_DRAW);

    glGenFramebuffers(1, &depth_map_framebuffer);

    glGenTextures(1, &depth_map);
    glBindTexture(GL_TEXTURE_2D, depth_map);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT, shadow_width, shadow_height, 0, GL_DEPTH_COMPONENT, GL_FLOAT, NULL);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

    glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depth_map, 0);
    glDrawBuffer(GL_NONE);
    glReadBuffer(GL_NONE);
    if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        std::cout << "error creating texture" << std::endl;
    }
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    std::string box_mesh("box");
        Mesh * objmesh = resource_pack.get_mesh(box_mesh);

    std::cout << objmesh->normals.size() << std::endl;

    glGenBuffers(1, &object_vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->vertices.size(), objmesh->vertices.data(), GL_STATIC_DRAW);

    glGenBuffers(1, &object_normal_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(float) * objmesh->normals.size(), objmesh->normals.data(), GL_STATIC_DRAW);
}